

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

string * __thiscall
google::protobuf::MethodDescriptorProto::mutable_output_type_abi_cxx11_(MethodDescriptorProto *this)

{
  string *this_00;
  MethodDescriptorProto *this_local;
  
  set_has_output_type(this);
  if (this->output_type_ == (string *)internal::kEmptyString_abi_cxx11_) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00);
    this->output_type_ = this_00;
  }
  return this->output_type_;
}

Assistant:

inline ::std::string* MethodDescriptorProto::mutable_output_type() {
  set_has_output_type();
  if (output_type_ == &::google::protobuf::internal::kEmptyString) {
    output_type_ = new ::std::string;
  }
  return output_type_;
}